

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O3

void write_sei_payload(h264_stream_t *h,bs_t *b)

{
  int *piVar1;
  uint8_t **ppuVar2;
  ulong uVar3;
  _Bool _Var4;
  byte bVar5;
  ushort uVar6;
  sei_scalability_info_t *psVar7;
  sei_t *psVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  uint8_t **ppuVar14;
  uint uVar15;
  byte *pbVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  
  psVar8 = h->sei;
  if (psVar8->payloadType != 0x18) {
    if (0 < psVar8->payloadSize) {
      lVar10 = 0;
      do {
        bVar5 = *(byte *)((long)((psVar8->field_2).sei_svc)->layers[0].roi + lVar10 + -0x4a);
        iVar9 = b->bits_left;
        if ((iVar9 == 8) && (b->p < b->end)) {
          *b->p = bVar5;
          b->p = b->p + 1;
        }
        else {
          uVar15 = 7;
          do {
            iVar9 = iVar9 + -1;
            b->bits_left = iVar9;
            pbVar16 = b->p;
            if (pbVar16 < b->end) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              *b->p = *b->p | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
              iVar9 = b->bits_left;
            }
            if (iVar9 == 0) {
              b->p = b->p + 1;
              b->bits_left = 8;
              iVar9 = 8;
            }
            bVar19 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar19);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < psVar8->payloadSize);
    }
    return;
  }
  psVar7 = (h->sei->field_2).sei_svc;
  _Var4 = psVar7->temporal_id_nesting_flag;
  piVar1 = &b->bits_left;
  iVar9 = b->bits_left + -1;
  b->bits_left = iVar9;
  ppuVar2 = &b->p;
  pbVar16 = b->p;
  if (pbVar16 < b->end) {
    *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
    **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    iVar9 = *piVar1;
    pbVar16 = *ppuVar2;
  }
  ppuVar14 = &b->end;
  if (iVar9 == 0) {
    pbVar16 = pbVar16 + 1;
    *ppuVar2 = pbVar16;
    iVar9 = 8;
  }
  _Var4 = psVar7->priority_layer_info_present_flag;
  iVar9 = iVar9 + -1;
  *piVar1 = iVar9;
  if (pbVar16 < *ppuVar14) {
    *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
    **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    iVar9 = *piVar1;
    pbVar16 = *ppuVar2;
  }
  if (iVar9 == 0) {
    pbVar16 = pbVar16 + 1;
    *ppuVar2 = pbVar16;
    iVar9 = 8;
  }
  _Var4 = psVar7->priority_id_setting_flag;
  iVar9 = iVar9 + -1;
  *piVar1 = iVar9;
  if (pbVar16 < *ppuVar14) {
    *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
    **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    iVar9 = *piVar1;
  }
  if (iVar9 == 0) {
    *ppuVar2 = *ppuVar2 + 1;
    *piVar1 = 8;
    iVar9 = 8;
  }
  uVar6 = psVar7->num_layers_minus1;
  if (uVar6 == 0) {
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    pbVar16 = *ppuVar2;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
      iVar9 = *piVar1;
    }
    if (iVar9 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
    }
  }
  else {
    uVar18 = (ulong)uVar6 + 1;
    if ((ulong)uVar6 == 0xffff) {
      uVar15 = 0x21;
    }
    else {
      if (uVar6 < 0xff) {
        iVar17 = *(int *)(bs_write_ue_len_table + uVar18 * 4);
      }
      else {
        iVar17 = *(int *)(bs_write_ue_len_table + (uVar18 >> 8) * 4) + 8;
      }
      if (iVar17 < 1) goto LAB_00141675;
      uVar15 = iVar17 * 2 - 1;
    }
    do {
      uVar15 = uVar15 - 1;
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 |
                    (((uint)uVar18 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
    } while (uVar15 != 0);
  }
LAB_00141675:
  uVar18 = 0;
  do {
    uVar6 = psVar7->layers[uVar18].layer_id;
    if (uVar6 == 0) {
      iVar9 = *piVar1 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        iVar9 = 8;
      }
    }
    else {
      uVar12 = (ulong)uVar6 + 1;
      if ((ulong)uVar6 == 0xffff) {
        iVar9 = *piVar1;
        uVar15 = 0x21;
      }
      else {
        if (uVar6 < 0xff) {
          iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
        }
        else {
          iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
        }
        iVar9 = *piVar1;
        if (iVar17 < 1) goto LAB_00141768;
        uVar15 = iVar17 * 2 - 1;
      }
      do {
        uVar15 = uVar15 - 1;
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 |
                      (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      } while (uVar15 != 0);
    }
LAB_00141768:
    bVar5 = psVar7->layers[uVar18].priority_id;
    uVar15 = 5;
    do {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      bVar19 = uVar15 != 0;
      uVar15 = uVar15 - 1;
    } while (bVar19);
    _Var4 = psVar7->layers[uVar18].discardable_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    pbVar16 = *ppuVar2;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
    }
    if (iVar9 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      iVar9 = 8;
    }
    bVar5 = psVar7->layers[uVar18].dependency_id;
    uVar15 = 2;
    do {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      bVar19 = uVar15 != 0;
      uVar15 = uVar15 - 1;
    } while (bVar19);
    bVar5 = psVar7->layers[uVar18].quality_id;
    uVar15 = 3;
    do {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      bVar19 = uVar15 != 0;
      uVar15 = uVar15 - 1;
    } while (bVar19);
    bVar5 = psVar7->layers[uVar18].temporal_id;
    uVar15 = 2;
    do {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      bVar19 = uVar15 != 0;
      uVar15 = uVar15 - 1;
    } while (bVar19);
    _Var4 = psVar7->layers[uVar18].sub_pic_layer_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    pbVar16 = *ppuVar2;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].sub_region_layer_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].iroi_division_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].profile_level_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].bitrate_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].frm_rate_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].frm_size_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].layer_dependency_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].parameter_sets_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].bitstream_restriction_info_present_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].exact_inter_layer_pred_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
    }
    if (iVar9 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      iVar9 = 8;
    }
    if (psVar7->layers[uVar18].sub_pic_layer_flag == true) {
      pbVar16 = *ppuVar2;
LAB_00141b8a:
      _Var4 = psVar7->layers[uVar18].exact_sample_value_match_flag;
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
        pbVar16 = *ppuVar2;
      }
      if (iVar9 == 0) {
        pbVar16 = pbVar16 + 1;
        *ppuVar2 = pbVar16;
        iVar9 = 8;
      }
    }
    else {
      pbVar16 = *ppuVar2;
      if (psVar7->layers[uVar18].iroi_division_info_present_flag == true) goto LAB_00141b8a;
    }
    _Var4 = psVar7->layers[uVar18].layer_conversion_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
      pbVar16 = *ppuVar2;
    }
    if (iVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      *ppuVar2 = pbVar16;
      iVar9 = 8;
    }
    _Var4 = psVar7->layers[uVar18].layer_output_flag;
    iVar9 = iVar9 + -1;
    *piVar1 = iVar9;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      iVar9 = *piVar1;
    }
    if (iVar9 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
      iVar9 = 8;
    }
    if (psVar7->layers[uVar18].profile_level_info_present_flag == true) {
      uVar15 = psVar7->layers[uVar18].layer_profile_level_idc;
      uVar13 = 0x17;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar13 != 0;
        uVar13 = uVar13 - 1;
      } while (bVar19);
    }
    if (psVar7->layers[uVar18].bitrate_info_present_flag == true) {
      uVar6 = psVar7->layers[uVar18].avg_bitrate;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      uVar6 = psVar7->layers[uVar18].max_bitrate_layer;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      uVar6 = psVar7->layers[uVar18].max_bitrate_layer_representation;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      uVar6 = psVar7->layers[uVar18].max_bitrate_calc_window;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
    }
    if (psVar7->layers[uVar18].frm_rate_info_present_flag == true) {
      bVar5 = psVar7->layers[uVar18].constant_frm_rate_idc;
      uVar15 = 1;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      uVar6 = psVar7->layers[uVar18].avg_frm_rate;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
    }
    if ((psVar7->layers[uVar18].frm_size_info_present_flag != false) ||
       (psVar7->layers[uVar18].iroi_division_info_present_flag == true)) {
      uVar6 = psVar7->layers[uVar18].frm_width_in_mbs_minus1;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00141f82;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00141f82:
      uVar6 = psVar7->layers[uVar18].frm_height_in_mbs_minus1;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00142056;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
    }
LAB_00142056:
    if (psVar7->layers[uVar18].sub_region_layer_flag == true) {
      uVar6 = psVar7->layers[uVar18].base_region_layer_id;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_0014212f;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_0014212f:
      _Var4 = psVar7->layers[uVar18].dynamic_rect_flag;
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      if (psVar7->layers[uVar18].dynamic_rect_flag == true) {
        uVar6 = psVar7->layers[uVar18].horizontal_offset;
        uVar15 = 0xf;
        do {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
          bVar19 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar19);
        uVar6 = psVar7->layers[uVar18].vertical_offset;
        uVar15 = 0xf;
        do {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
          bVar19 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar19);
        uVar6 = psVar7->layers[uVar18].region_width;
        uVar15 = 0xf;
        do {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
          bVar19 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar19);
        uVar6 = psVar7->layers[uVar18].region_height;
        uVar15 = 0xf;
        do {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
          bVar19 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar19);
      }
    }
    if (psVar7->layers[uVar18].sub_pic_layer_flag == true) {
      uVar6 = psVar7->layers[uVar18].roi_id;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_001423a0;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
    }
LAB_001423a0:
    if (psVar7->layers[uVar18].iroi_division_info_present_flag == true) {
      _Var4 = psVar7->layers[uVar18].iroi_grid_flag;
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      if (psVar7->layers[uVar18].iroi_grid_flag == true) {
        uVar6 = psVar7->layers[uVar18].grid_width_in_mbs_minus1;
        if (uVar6 == 0) {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            uVar15 = 0x21;
          }
          else {
            if (uVar6 < 0xff) {
              iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (iVar17 < 1) goto LAB_0014255d;
            uVar15 = iVar17 * 2 - 1;
          }
          do {
            uVar15 = uVar15 - 1;
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          } while (uVar15 != 0);
        }
LAB_0014255d:
        uVar6 = psVar7->layers[uVar18].grid_height_in_mbs_minus1;
        if (uVar6 == 0) {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            uVar15 = 0x21;
          }
          else {
            if (uVar6 < 0xff) {
              iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (iVar17 < 1) goto LAB_0014293d;
            uVar15 = iVar17 * 2 - 1;
          }
          do {
            uVar15 = uVar15 - 1;
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          } while (uVar15 != 0);
        }
      }
      else {
        uVar6 = psVar7->layers[uVar18].num_rois_minus1;
        if (uVar6 == 0) {
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            uVar15 = 0x21;
          }
          else {
            if (uVar6 < 0xff) {
              iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (iVar17 < 1) goto LAB_00142642;
            uVar15 = iVar17 * 2 - 1;
          }
          do {
            uVar15 = uVar15 - 1;
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          } while (uVar15 != 0);
        }
LAB_00142642:
        uVar12 = 0;
        do {
          uVar6 = psVar7->layers[uVar18].roi[uVar12].first_mb_in_roi;
          if (uVar6 == 0) {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar17 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar17 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar17 < 1) goto LAB_00142721;
              uVar15 = iVar17 * 2 - 1;
            }
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_00142721:
          uVar6 = psVar7->layers[uVar18].roi[uVar12].roi_width_in_mbs_minus1;
          if (uVar6 == 0) {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar17 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar17 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar17 < 1) goto LAB_001427f6;
              uVar15 = iVar17 * 2 - 1;
            }
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_001427f6:
          uVar6 = psVar7->layers[uVar18].roi[uVar12].roi_height_in_mbs_minus1;
          if (uVar6 == 0) {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar17 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar17 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar17 < 1) goto LAB_001428c7;
              uVar15 = iVar17 * 2 - 1;
            }
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_001428c7:
          bVar19 = uVar12 < psVar7->layers[uVar18].num_rois_minus1;
          uVar12 = uVar12 + 1;
        } while (bVar19);
      }
    }
LAB_0014293d:
    if (psVar7->layers[uVar18].layer_dependency_info_present_flag == true) {
      uVar6 = psVar7->layers[uVar18].num_directly_dependent_layers;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00142aa3;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00142aa3:
      if (psVar7->layers[uVar18].num_directly_dependent_layers != 0) {
        uVar12 = 0;
        do {
          uVar6 = psVar7->layers[uVar18].directly_dependent_layer_id_delta_minus1[uVar12];
          if (uVar6 == 0) {
            iVar9 = *piVar1 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar9 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar9 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar9 < 1) goto LAB_00142b81;
              uVar15 = iVar9 * 2 - 1;
            }
            iVar9 = *piVar1;
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_00142b81:
          uVar12 = uVar12 + 1;
        } while (uVar12 < psVar7->layers[uVar18].num_directly_dependent_layers);
      }
    }
    else {
      uVar6 = psVar7->layers[uVar18].layer_dependency_info_src_layer_id_delta;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00142bf1;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
    }
LAB_00142bf1:
    if (psVar7->layers[uVar18].parameter_sets_info_present_flag == true) {
      uVar6 = psVar7->layers[uVar18].num_seq_parameter_sets;
      if (uVar6 == 0) {
        iVar9 = *piVar1 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar9 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar9 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar9 < 1) goto LAB_00142d55;
          uVar15 = iVar9 * 2 - 1;
        }
        iVar9 = *piVar1;
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00142d55:
      if (psVar7->layers[uVar18].num_seq_parameter_sets != 0) {
        uVar12 = 0;
        do {
          uVar6 = psVar7->layers[uVar18].seq_parameter_set_id_delta[uVar12];
          if (uVar6 == 0) {
            iVar9 = *piVar1 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar9 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar9 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar9 < 1) goto LAB_00142e33;
              uVar15 = iVar9 * 2 - 1;
            }
            iVar9 = *piVar1;
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_00142e33:
          uVar12 = uVar12 + 1;
        } while (uVar12 < psVar7->layers[uVar18].num_seq_parameter_sets);
      }
      uVar6 = psVar7->layers[uVar18].num_subset_seq_parameter_sets;
      if (uVar6 == 0) {
        iVar9 = *piVar1 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar9 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar9 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar9 < 1) goto LAB_00142f80;
          uVar15 = iVar9 * 2 - 1;
        }
        iVar9 = *piVar1;
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00142f80:
      if (psVar7->layers[uVar18].num_subset_seq_parameter_sets != 0) {
        uVar12 = 0;
        do {
          uVar6 = psVar7->layers[uVar18].subset_seq_parameter_set_id_delta[uVar12];
          if (uVar6 == 0) {
            iVar9 = *piVar1 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar9 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar9 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar9 < 1) goto LAB_0014305e;
              uVar15 = iVar9 * 2 - 1;
            }
            iVar9 = *piVar1;
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_0014305e:
          uVar12 = uVar12 + 1;
        } while (uVar12 < psVar7->layers[uVar18].num_subset_seq_parameter_sets);
      }
      uVar6 = psVar7->layers[uVar18].num_pic_parameter_sets_minus1;
      if (uVar6 == 0) {
        iVar9 = *piVar1 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar9 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar9 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar9 < 1) goto LAB_0014313a;
          uVar15 = iVar9 * 2 - 1;
        }
        iVar9 = *piVar1;
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_0014313a:
      if (psVar7->layers[uVar18].num_pic_parameter_sets_minus1 != 0) {
        uVar12 = 0;
        do {
          uVar6 = psVar7->layers[uVar18].pic_parameter_set_id_delta[uVar12];
          if (uVar6 == 0) {
            iVar9 = *piVar1 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              uVar15 = 0x21;
            }
            else {
              if (uVar6 < 0xff) {
                iVar9 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar9 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (iVar9 < 1) goto LAB_00143218;
              uVar15 = iVar9 * 2 - 1;
            }
            iVar9 = *piVar1;
            do {
              uVar15 = uVar15 - 1;
              iVar9 = iVar9 + -1;
              *piVar1 = iVar9;
              pbVar16 = *ppuVar2;
              if (pbVar16 < *ppuVar14) {
                *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                iVar9 = *piVar1;
              }
              if (iVar9 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
                iVar9 = 8;
              }
            } while (uVar15 != 0);
          }
LAB_00143218:
          uVar12 = uVar12 + 1;
        } while (uVar12 < psVar7->layers[uVar18].num_pic_parameter_sets_minus1);
      }
    }
    else {
      uVar6 = psVar7->layers[uVar18].parameter_sets_info_src_layer_id_delta;
      if (uVar6 == 0) {
        iVar9 = *piVar1 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar9 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar9 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar9 < 1) goto LAB_0014322c;
          uVar15 = iVar9 * 2 - 1;
        }
        iVar9 = *piVar1;
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
    }
LAB_0014322c:
    if (psVar7->layers[uVar18].bitstream_restriction_info_present_flag == true) {
      _Var4 = psVar7->layers[uVar18].motion_vectors_over_pic_boundaries_flag;
      iVar9 = *piVar1 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      uVar6 = psVar7->layers[uVar18].max_bytes_per_pic_denom;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00143344;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00143344:
      uVar6 = psVar7->layers[uVar18].max_bits_per_mb_denom;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00143412;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00143412:
      uVar6 = psVar7->layers[uVar18].log2_max_mv_length_horizontal;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_001434e0;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_001434e0:
      uVar6 = psVar7->layers[uVar18].log2_max_mv_length_vertical;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_001435ae;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_001435ae:
      uVar6 = psVar7->layers[uVar18].max_num_reorder_frames;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_0014367c;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_0014367c:
      uVar6 = psVar7->layers[uVar18].max_dec_frame_buffering;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00143745;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
    }
LAB_00143745:
    if (psVar7->layers[uVar18].layer_conversion_flag == true) {
      uVar6 = psVar7->layers[uVar18].conversion_type_idc;
      if (uVar6 == 0) {
        iVar9 = *piVar1 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar9 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar9 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (iVar9 < 1) goto LAB_00143818;
          uVar15 = iVar9 * 2 - 1;
        }
        iVar9 = *piVar1;
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00143818:
      iVar9 = *piVar1;
      lVar10 = 0;
      bVar19 = true;
      do {
        bVar11 = bVar19;
        _Var4 = psVar7->layers[uVar18].rewriting_info_flag[lVar10];
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        if (psVar7->layers[uVar18].rewriting_info_flag[lVar10] == true) {
          uVar15 = psVar7->layers[uVar18].rewriting_profile_level_idc[lVar10];
          uVar13 = 0x17;
          do {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
            bVar19 = uVar13 != 0;
            uVar13 = uVar13 - 1;
          } while (bVar19);
          uVar6 = psVar7->layers[uVar18].rewriting_avg_bitrate[lVar10];
          uVar15 = 0xf;
          do {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
            bVar19 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar19);
          uVar6 = psVar7->layers[uVar18].rewriting_max_bitrate[lVar10];
          uVar15 = 0xf;
          do {
            iVar9 = iVar9 + -1;
            *piVar1 = iVar9;
            pbVar16 = *ppuVar2;
            if (pbVar16 < *ppuVar14) {
              *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              iVar9 = *piVar1;
            }
            if (iVar9 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
              iVar9 = 8;
            }
            bVar19 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar19);
        }
        lVar10 = 1;
        bVar19 = false;
      } while (bVar11);
    }
    bVar19 = uVar18 < psVar7->num_layers_minus1;
    uVar18 = uVar18 + 1;
  } while (bVar19);
  if (psVar7->priority_layer_info_present_flag == false) {
    return;
  }
  uVar6 = psVar7->pr_num_dIds_minus1;
  if (uVar6 == 0) {
    iVar9 = *piVar1 + -1;
    *piVar1 = iVar9;
    pbVar16 = *ppuVar2;
    if (pbVar16 < *ppuVar14) {
      *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
      **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
      iVar9 = *piVar1;
    }
    if (iVar9 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
    }
  }
  else {
    uVar18 = (ulong)uVar6 + 1;
    if ((ulong)uVar6 == 0xffff) {
      uVar15 = 0x21;
    }
    else {
      if (uVar6 < 0xff) {
        iVar9 = *(int *)(bs_write_ue_len_table + uVar18 * 4);
      }
      else {
        iVar9 = *(int *)(bs_write_ue_len_table + (uVar18 >> 8) * 4) + 8;
      }
      if (iVar9 < 1) goto LAB_00143a7d;
      uVar15 = iVar9 * 2 - 1;
    }
    iVar9 = *piVar1;
    do {
      uVar15 = uVar15 - 1;
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 |
                    (((uint)uVar18 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
    } while (uVar15 != 0);
  }
LAB_00143a7d:
  iVar9 = *piVar1;
  uVar18 = 0;
  do {
    bVar5 = psVar7->pr[uVar18].pr_dependency_id;
    uVar15 = 2;
    do {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
        iVar9 = 8;
      }
      bVar19 = uVar15 != 0;
      uVar15 = uVar15 - 1;
    } while (bVar19);
    uVar6 = psVar7->pr[uVar18].pr_num_minus1;
    if (uVar6 == 0) {
      iVar9 = iVar9 + -1;
      *piVar1 = iVar9;
      pbVar16 = *ppuVar2;
      if (pbVar16 < *ppuVar14) {
        *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
        **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
        iVar9 = *piVar1;
      }
      if (iVar9 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        iVar9 = 8;
      }
    }
    else {
      uVar12 = (ulong)uVar6 + 1;
      if ((ulong)uVar6 == 0xffff) {
        uVar15 = 0x21;
      }
      else {
        if (uVar6 < 0xff) {
          iVar17 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
        }
        else {
          iVar17 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
        }
        if (iVar17 < 1) goto LAB_00143bb6;
        uVar15 = iVar17 * 2 - 1;
      }
      do {
        uVar15 = uVar15 - 1;
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 |
                      (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
      } while (uVar15 != 0);
    }
LAB_00143bb6:
    uVar12 = 0;
    do {
      uVar6 = psVar7->pr[uVar18].pr_info[uVar12].pr_id;
      if (uVar6 == 0) {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          iVar9 = 8;
        }
      }
      else {
        uVar3 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          uVar15 = 0x21;
        }
        else {
          if (uVar6 < 0xff) {
            iVar17 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
          }
          else {
            iVar17 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
          }
          if (iVar17 < 1) goto LAB_00143c8c;
          uVar15 = iVar17 * 2 - 1;
        }
        do {
          uVar15 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          *piVar1 = iVar9;
          pbVar16 = *ppuVar2;
          if (pbVar16 < *ppuVar14) {
            *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            iVar9 = *piVar1;
          }
          if (iVar9 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
            iVar9 = 8;
          }
        } while (uVar15 != 0);
      }
LAB_00143c8c:
      uVar15 = psVar7->pr[uVar18].pr_info[uVar12].pr_profile_level_idc;
      uVar13 = 0x17;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar13 != 0;
        uVar13 = uVar13 - 1;
      } while (bVar19);
      uVar6 = psVar7->pr[uVar18].pr_info[uVar12].pr_avg_bitrate;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      uVar6 = psVar7->pr[uVar18].pr_info[uVar12].pr_max_bitrate;
      uVar15 = 0xf;
      do {
        iVar9 = iVar9 + -1;
        *piVar1 = iVar9;
        pbVar16 = *ppuVar2;
        if (pbVar16 < *ppuVar14) {
          *pbVar16 = *pbVar16 & ~(byte)(1 << ((byte)iVar9 & 0x1f));
          **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          iVar9 = *piVar1;
        }
        if (iVar9 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
          iVar9 = 8;
        }
        bVar19 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar19);
      bVar19 = uVar12 < psVar7->pr[uVar18].pr_num_minus1;
      uVar12 = uVar12 + 1;
    } while (bVar19);
    bVar19 = psVar7->pr_num_dIds_minus1 <= uVar18;
    uVar18 = uVar18 + 1;
    if (bVar19) {
      return;
    }
  } while( true );
}

Assistant:

void write_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 0 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            write_sei_scalability_info( h, b );
            break;
        default:
            if( 0 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                bs_write_u8(b, s->data[i]);
    }
    
    //if( 0 )
    //    read_sei_end_bits(h, b);
}